

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fshifter.cpp
# Opt level: O3

void anon_unknown.dwarf_174c0a::Fshifter_setParami(EffectProps *props,ALenum param,int val)

{
  long lVar1;
  effect_exception *this;
  
  if (param == 3) {
    lVar1 = 8;
    if ((uint)val < 3) {
LAB_001477fd:
      *(int *)((long)props + lVar1) = val;
      return;
    }
    this = (effect_exception *)__cxa_allocate_exception(0x30);
    effect_exception::effect_exception(this,0xa003,"Frequency shifter right direction out of range")
    ;
  }
  else if (param == 2) {
    lVar1 = 4;
    if ((uint)val < 3) goto LAB_001477fd;
    this = (effect_exception *)__cxa_allocate_exception(0x30);
    effect_exception::effect_exception(this,0xa003,"Frequency shifter left direction out of range");
  }
  else {
    this = (effect_exception *)__cxa_allocate_exception(0x30);
    effect_exception::effect_exception
              (this,0xa002,"Invalid frequency shifter integer property 0x%04x",(ulong)(uint)param);
  }
  __cxa_throw(this,&effect_exception::typeinfo,al::base_exception::~base_exception);
}

Assistant:

void Fshifter_setParami(EffectProps *props, ALenum param, int val)
{
    switch(param)
    {
    case AL_FREQUENCY_SHIFTER_LEFT_DIRECTION:
        if(!(val >= AL_FREQUENCY_SHIFTER_MIN_LEFT_DIRECTION && val <= AL_FREQUENCY_SHIFTER_MAX_LEFT_DIRECTION))
            throw effect_exception{AL_INVALID_VALUE,
                "Frequency shifter left direction out of range"};
        props->Fshifter.LeftDirection = val;
        break;

    case AL_FREQUENCY_SHIFTER_RIGHT_DIRECTION:
        if(!(val >= AL_FREQUENCY_SHIFTER_MIN_RIGHT_DIRECTION && val <= AL_FREQUENCY_SHIFTER_MAX_RIGHT_DIRECTION))
            throw effect_exception{AL_INVALID_VALUE,
                "Frequency shifter right direction out of range"};
        props->Fshifter.RightDirection = val;
        break;

    default:
        throw effect_exception{AL_INVALID_ENUM,
            "Invalid frequency shifter integer property 0x%04x", param};
    }
}